

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

void __thiscall sophia_interface::LUPREP_checkFlavour(sophia_interface *this,int IP)

{
  int KF;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int J;
  long lVar6;
  sophia_interface *psVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  sophia_interface *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  double dStack_68;
  double DPS [5];
  int local_38;
  int local_34;
  
  DPS[1] = 0.0;
  DPS[2] = 0.0;
  dStack_68 = 0.0;
  DPS[0] = 0.0;
  DPS[3] = 0.0;
  uVar1 = 1;
  if (1 < IP) {
    uVar1 = IP;
  }
  if ((int)uVar1 <= this->N) {
    piVar8 = (int *)((long)(this->P + -1) + ((ulong)uVar1 * 2 + 0x1f3e) * 4);
    lVar9 = (ulong)uVar1 - 1;
    local_38 = 0;
    local_34 = 0;
    psVar7 = this;
    iVar10 = 0;
    do {
      iVar4 = iVar10;
      if (0xfffffff5 < this->K[0][lVar9] - 0xbU) {
        KF = this->K[1][lVar9];
        iVar2 = LUCOMP(psVar7,KF);
        if (iVar2 != 0) {
          iVar3 = -KCHG[0][(long)iVar2 + 499];
          if (-1 < KF) {
            iVar3 = KCHG[0][(long)iVar2 + 499];
          }
          if (iVar3 != 0) {
            if (iVar3 != 2) {
              local_38 = local_38 + 1;
              local_34 = local_34 + iVar3;
              MSTJ[0x5c] = 1;
              dVar11 = ULMASS(psVar7,this->K[1][lVar9]);
              DPS[3] = dVar11 + DPS[3];
            }
            iVar4 = iVar10 + 1;
            lVar6 = 0;
            piVar5 = piVar8;
            do {
              DPS[lVar6 + -1] = *(double *)piVar5 + DPS[lVar6 + -1];
              lVar6 = lVar6 + 1;
              piVar5 = piVar5 + 8000;
            } while (lVar6 != 4);
            if (this->K[0][lVar9] == 1) {
              if (iVar10 != 0) {
                if (((local_38 == 1) || (2 < local_38)) || (local_34 != 0)) {
                  psVar7 = (sophia_interface *)local_a8;
                  local_a8[0] = (sophia_interface *)local_98;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_a8,"LUPREP: unphysical flavour combination","");
                  LUERRM(psVar7,2,(string *)local_a8);
                  psVar7 = local_a8[0];
                  if (local_a8[0] != (sophia_interface *)local_98) {
                    operator_delete(local_a8[0]);
                  }
                }
                dVar11 = PARJ[0x1f] * 0.9 + DPS[3];
                if (((DPS[2] * DPS[2] - dStack_68 * dStack_68) - DPS[0] * DPS[0]) - DPS[1] * DPS[1]
                    < dVar11 * dVar11) {
                  psVar7 = (sophia_interface *)local_88;
                  local_88._0_8_ = (sophia_interface *)(local_88 + 0x10);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_88,"LUPREP: too small mass in jet system","");
                  LUERRM(psVar7,3,(string *)local_88);
                  psVar7 = (sophia_interface *)local_88._0_8_;
                  if ((sophia_interface *)local_88._0_8_ != (sophia_interface *)(local_88 + 0x10)) {
                    operator_delete((void *)local_88._0_8_);
                  }
                }
              }
              DPS[1] = 0.0;
              DPS[2] = 0.0;
              dStack_68 = 0.0;
              DPS[0] = 0.0;
              DPS[3] = 0.0;
              local_34 = 0;
              local_38 = 0;
              iVar4 = 0;
            }
          }
        }
      }
      lVar9 = lVar9 + 1;
      piVar8 = piVar8 + 2;
      iVar10 = iVar4;
    } while (lVar9 < this->N);
  }
  return;
}

Assistant:

void sophia_interface::LUPREP_checkFlavour(int IP) {
// Serves as a local function of LUPREP. Solves goto->320 statement.
// When this function is called, LUPREP returns.
    // Check flavours and invariant masses in parton systems.
    int NP = 0;
    int KFN = 0;
    int KQS = 0;
    double DPS[5] = {0., 0., 0., 0., 0.};
    for (int I = std::max(1, IP) - 1; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        int KC = LUCOMP(K[1][I]);
        if (KC == 0) continue;
        int sgn = (K[1][I] < 0)? -1 : 1;
        int KQ = KCHG[1][KC - 1] * sgn;
        if (KQ == 0) continue;
        NP++;
        if (KQ != 2) {
            KFN++;
            KQS += KQ;
            MSTJ[92] = 1;
            DPS[4] += ULMASS(K[1][I]);
        }
        for (int J = 0; J < 4; ++J) {
            DPS[J] += P[J][I];
        }
        if (K[0][I] == 1) {
            if (NP != 1 && (KFN == 1 || KFN >= 3 || KQS != 0)) LUERRM(2, "LUPREP: unphysical flavour combination");
            if (NP != 1 && DPS[3] * DPS[3] - DPS[0] * DPS[0] - DPS[1] * DPS[1] - DPS[2] * DPS[2] < std::pow(0.9 * PARJ[31] + DPS[4], 2)) LUERRM(3, "LUPREP: too small mass in jet system");
            NP = 0;
            KFN = 0;
            KQS = 0;
            for (int J = 0; J < 5; ++J) {
                DPS[J] = 0.;
            }
        }
    }
    return;
}